

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O0

void __thiscall
ot::commissioner::CommissionerSafe::
SetActiveDataset(std::function<void(ot::commissioner::Error)>,ot::commissioner::ActiveOperationalDataset_const&)
::$_0::~__0(__0 *this)

{
  anon_class_256_3_2539074c *this_local;
  
  ActiveOperationalDataset::~ActiveOperationalDataset((ActiveOperationalDataset *)(this + 0x28));
  std::function<void_(ot::commissioner::Error)>::~function
            ((function<void_(ot::commissioner::Error)> *)(this + 8));
  return;
}

Assistant:

Error CommissionerSafe::SetActiveDataset(const ActiveOperationalDataset &aDataset)
{
    std::promise<Error> pro;
    auto                wait = [&pro](Error aError) { pro.set_value(aError); };

    SetActiveDataset(wait, aDataset);
    return pro.get_future().get();
}